

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O0

void rev_project_wrench(kcc_joint *joint,mc_abi *m,mc_wrench *f,mc_wrench *r,int count)

{
  joint_axis jVar1;
  double dVar2;
  double dVar3;
  double m1;
  double m2;
  int i;
  double qdd;
  int j;
  double d;
  int k;
  int count_local;
  mc_wrench *r_local;
  mc_wrench *f_local;
  mc_abi *m_local;
  kcc_joint *joint_local;
  
  if (joint == (kcc_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x197,
                  "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
                 );
  }
  if (m == (mc_abi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x198,
                  "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
                 );
  }
  if (f == (mc_wrench *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x199,
                  "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
                 );
  }
  if (r != (mc_wrench *)0x0) {
    if (f == r) {
      __assert_fail("f != r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                    ,0x19b,
                    "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
                   );
    }
    jVar1 = (joint->field_1).revolute_joint.axis;
    dVar2 = *(double *)
             ((long)&(m->second_moment_of_mass).field_0 +
             (long)(int)jVar1 * 8 + (long)(int)jVar1 * 0x18) +
            *(joint->field_1).revolute_joint.inertia;
    if ((dVar2 == 0.0) && (!NAN(dVar2))) {
      __assert_fail("d != 0.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                    ,0x1a1,
                    "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
                   );
    }
    for (qdd._4_4_ = 0; qdd._4_4_ < count; qdd._4_4_ = qdd._4_4_ + 1) {
      dVar3 = f->torque[qdd._4_4_].field_0.data[(int)jVar1] / dVar2;
      for (m2._4_4_ = 0; m2._4_4_ < 3; m2._4_4_ = m2._4_4_ + 1) {
        r->torque[qdd._4_4_].field_0.data[m2._4_4_] =
             -*(double *)
               ((long)&(m->second_moment_of_mass).field_0 +
               (long)(int)jVar1 * 8 + (long)m2._4_4_ * 0x18) * dVar3 +
             f->torque[qdd._4_4_].field_0.data[m2._4_4_];
        r->force[qdd._4_4_].field_0.data[m2._4_4_] =
             -*(double *)
               ((long)&(m->first_moment_of_mass).field_0 +
               (long)m2._4_4_ * 8 + (long)(int)jVar1 * 0x18) * dVar3 +
             f->force[qdd._4_4_].field_0.data[m2._4_4_];
      }
    }
    return;
  }
  __assert_fail("r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x19a,
                "void rev_project_wrench(const struct kcc_joint *, const struct mc_abi *, const struct mc_wrench *, struct mc_wrench *, int)"
               );
}

Assistant:

static void rev_project_wrench(
        const struct kcc_joint *joint,
        const struct mc_abi *m,
        const struct mc_wrench *f,
        struct mc_wrench *r,
        int count)
{
    assert(joint);
    assert(m);
    assert(f);
    assert(r);
    assert(f != r);

    int k = joint->revolute_joint.axis;

    double d = m->second_moment_of_mass.row[k].data[k]
            + joint->revolute_joint.inertia[0];
    assert(d != 0.0);

    for (int j = 0; j < count; j++) {
        double qdd = f->torque[j].data[k] / d;

        for (int i = 0; i < 3; i++) {
            double m2 = m->second_moment_of_mass.row[i].data[k];
            r->torque[j].data[i] = f->torque[j].data[i] - (m2 * qdd);

            double m1 = m->first_moment_of_mass.row[k].data[i];               // consider transpose, thus [k, i]
            r->force[j].data[i] = f->force[j].data[i]- (m1 * qdd);
        }
    }
}